

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ConvertMnemonicToSeedRequest::ConvertMnemonicToSeedRequest
          (ConvertMnemonicToSeedRequest *this)

{
  allocator local_1e;
  allocator local_1d [13];
  ConvertMnemonicToSeedRequest *local_10;
  ConvertMnemonicToSeedRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ConvertMnemonicToSeedRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ConvertMnemonicToSeedRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::ConvertMnemonicToSeedRequest>)._vptr_JsonClassBase
       = (_func_int **)&PTR__ConvertMnemonicToSeedRequest_01b3b690;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->mnemonic_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->passphrase_,"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  this->strict_check_ = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->language_,"",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  this->use_ideographic_space_ = false;
  CollectFieldName();
  return;
}

Assistant:

ConvertMnemonicToSeedRequest() {
    CollectFieldName();
  }